

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lambda_functions.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::ListLambdaBindData::Deserialize(Deserializer *deserializer,ScalarFunction *param_2)

{
  _func_int **pp_Var1;
  int iVar2;
  int iVar3;
  ListLambdaBindData *this;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var4;
  LogicalType return_type;
  undefined1 local_48 [32];
  
  (*(param_2->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function[2])
            (param_2,100,"return_type");
  (*(param_2->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function[6])
            (param_2);
  LogicalType::Deserialize((LogicalType *)(local_48 + 8),(Deserializer *)param_2);
  (*(param_2->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function[7])
            (param_2);
  (*(param_2->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function[3])
            (param_2);
  iVar2 = (*(param_2->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function
            [4])(param_2,0x65,"lambda_expr");
  pp_Var1 = (param_2->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function;
  if ((char)iVar2 == '\0') {
    _Var4._M_head_impl = (Expression *)0x0;
    (*pp_Var1[5])(param_2,0);
  }
  else {
    iVar2 = (*pp_Var1[10])(param_2);
    if ((char)iVar2 == '\0') {
      _Var4._M_head_impl = (Expression *)0x0;
    }
    else {
      (*(param_2->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function[6])
                (param_2);
      Expression::Deserialize((Expression *)local_48,(Deserializer *)param_2);
      (*(param_2->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function[7])
                (param_2);
      _Var4._M_head_impl = (Expression *)local_48._0_8_;
    }
    (*(param_2->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function[0xb])
              (param_2);
    (*(param_2->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function[5])
              (param_2,1);
  }
  (*(param_2->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function[2])
            (param_2,0x66,"has_index");
  iVar2 = (*(param_2->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function
            [0xc])(param_2);
  (*(param_2->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function[3])
            (param_2);
  (*(param_2->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function[2])
            (param_2,0x67,"has_initial");
  iVar3 = (*(param_2->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function
            [0xc])(param_2);
  (*(param_2->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function[3])
            (param_2);
  this = (ListLambdaBindData *)operator_new(0x30);
  local_48._0_8_ = _Var4._M_head_impl;
  ListLambdaBindData(this,(LogicalType *)(local_48 + 8),
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)local_48,SUB41(iVar2,0),SUB41(iVar3,0));
  if ((Expression *)local_48._0_8_ != (Expression *)0x0) {
    (**(code **)(*(_func_int **)local_48._0_8_ + 8))();
  }
  deserializer->_vptr_Deserializer = (_func_int **)this;
  LogicalType::~LogicalType((LogicalType *)(local_48 + 8));
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)deserializer;
}

Assistant:

unique_ptr<FunctionData> ListLambdaBindData::Deserialize(Deserializer &deserializer, ScalarFunction &) {
	auto return_type = deserializer.ReadProperty<LogicalType>(100, "return_type");
	auto lambda_expr = deserializer.ReadPropertyWithExplicitDefault<unique_ptr<Expression>>(101, "lambda_expr",
	                                                                                        unique_ptr<Expression>());
	auto has_index = deserializer.ReadProperty<bool>(102, "has_index");
	auto has_initial = deserializer.ReadProperty<bool>(103, "has_initial");
	return make_uniq<ListLambdaBindData>(return_type, std::move(lambda_expr), has_index, has_initial);
}